

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O2

void duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,_false>::PlainSkip<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  
  uVar1 = ByteBuffer::read<unsigned_int>(plain_data);
  ByteBuffer::inc(plain_data,(ulong)uVar1);
  return;
}

Assistant:

static void PlainSkip(ByteBuffer &plain_data, ColumnReader &reader) {
		uint32_t decimal_len = FIXED_LENGTH ? reader.Schema().type_length : plain_data.read<uint32_t>();
		plain_data.inc(decimal_len);
	}